

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit,
                    int fTryConf,int fUseLit)

{
  Pdr_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pObj;
  abctime aVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  Pdr_Set_t *pPVar7;
  abctime aVar8;
  int local_d4;
  abctime clk_1;
  abctime Limit;
  abctime clk;
  int RetValue;
  int Lit;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  int local_38;
  int fLitUsed;
  int fTryConf_local;
  int nConfLimit_local;
  Pdr_Set_t **ppPred_local;
  Pdr_Set_t *pCube_local;
  Pdr_Man_t *pPStack_18;
  int k_local;
  Pdr_Man_t *p_local;
  
  pSat._4_4_ = 0;
  p->nCalls = p->nCalls + 1;
  local_38 = fTryConf;
  fLitUsed = nConfLimit;
  _fTryConf_local = ppPred;
  ppPred_local = (Pdr_Set_t **)pCube;
  pCube_local._4_4_ = k;
  pPStack_18 = p;
  vLits = (Vec_Int_t *)Pdr_ManFetchSolver(p,k);
  if (ppPred_local == (Pdr_Set_t **)0x0) {
    Limit = Abc_Clock();
    p_00 = pPStack_18;
    iVar1 = pCube_local._4_4_;
    pObj = Aig_ManCo(pPStack_18->pAig,pPStack_18->iOutCur);
    iVar1 = Pdr_ObjSatVar(p_00,iVar1,2,pObj);
    clk._4_4_ = Abc_Var2Lit(iVar1,0);
    pVVar5 = vLits;
    aVar2 = Pdr_ManTimeLimit(pPStack_18);
    aVar2 = sat_solver_set_runtime_limit((sat_solver *)pVVar5,aVar2);
    clk._0_4_ = sat_solver_solve((sat_solver *)vLits,(lit *)((long)&clk + 4),&RetValue,
                                 (long)fLitUsed,0,0,0);
    sat_solver_set_runtime_limit((sat_solver *)vLits,aVar2);
    if ((int)clk == 0) {
      return -1;
    }
  }
  else {
    if (fUseLit == 0) {
      _RetValue = Pdr_ManCubeToLits(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local,0,1);
    }
    else {
      pSat._4_4_ = 1;
      Vec_IntAddToEntry(pPStack_18->vActVars,pCube_local._4_4_,1);
      _RetValue = Pdr_ManCubeToLits(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local,1,0);
      iVar1 = Pdr_ManFreeVar(pPStack_18,pCube_local._4_4_);
      clk._4_4_ = Abc_Var2Lit(iVar1,0);
      Vec_IntPush(_RetValue,clk._4_4_);
      pVVar5 = vLits;
      piVar3 = Vec_IntArray(_RetValue);
      piVar4 = Vec_IntArray(_RetValue);
      iVar1 = Vec_IntSize(_RetValue);
      clk._0_4_ = sat_solver_addclause((sat_solver *)pVVar5,piVar3,piVar4 + iVar1);
      if ((int)clk != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                      ,0x143,
                      "int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int, int, int)"
                     );
      }
      sat_solver_compress((sat_solver *)vLits);
      pVVar5 = Pdr_ManCubeToLits(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local,0,1);
      _RetValue = pVVar5;
      iVar1 = Abc_LitNot(clk._4_4_);
      Vec_IntPush(pVVar5,iVar1);
    }
    Limit = Abc_Clock();
    pVVar5 = vLits;
    aVar2 = Pdr_ManTimeLimit(pPStack_18);
    aVar2 = sat_solver_set_runtime_limit((sat_solver *)pVVar5,aVar2);
    pVVar5 = vLits;
    piVar3 = Vec_IntArray(_RetValue);
    piVar4 = Vec_IntArray(_RetValue);
    iVar1 = Vec_IntSize(_RetValue);
    if (local_38 == 0) {
      local_d4 = fLitUsed;
    }
    else {
      local_d4 = pPStack_18->pPars->nConfGenLimit;
    }
    clk._0_4_ = sat_solver_solve((sat_solver *)pVVar5,piVar3,piVar4 + iVar1,(long)local_d4,0,0,0);
    sat_solver_set_runtime_limit((sat_solver *)vLits,aVar2);
    if ((int)clk == 0) {
      if ((local_38 == 0) || (pPStack_18->pPars->nConfGenLimit == 0)) {
        return -1;
      }
      clk._0_4_ = 1;
    }
  }
  aVar2 = Abc_Clock();
  lVar6 = aVar2 - Limit;
  pPStack_18->tSat = lVar6 + pPStack_18->tSat;
  if ((int)clk != 0) {
    if ((int)clk == -1) {
      pPStack_18->tSatUnsat = lVar6 + pPStack_18->tSatUnsat;
      pPStack_18->nCallsU = pPStack_18->nCallsU + 1;
      if (_fTryConf_local != (Pdr_Set_t **)0x0) {
        *_fTryConf_local = (Pdr_Set_t *)0x0;
      }
      clk._0_4_ = 1;
    }
    else {
      pPStack_18->tSatSat = lVar6 + pPStack_18->tSatSat;
      pPStack_18->nCallsS = pPStack_18->nCallsS + 1;
      if (_fTryConf_local != (Pdr_Set_t **)0x0) {
        aVar2 = Abc_Clock();
        if (pPStack_18->pPars->fNewXSim == 0) {
          pPVar7 = Pdr_ManTernarySim(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local);
          *_fTryConf_local = pPVar7;
        }
        else {
          pPVar7 = Txs3_ManTernarySim(pPStack_18->pTxs3,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local)
          ;
          *_fTryConf_local = pPVar7;
        }
        aVar8 = Abc_Clock();
        pPStack_18->tTsim = (aVar8 - aVar2) + pPStack_18->tTsim;
        pPStack_18->nXsimLits = (*_fTryConf_local)->nLits + pPStack_18->nXsimLits;
        pPStack_18->nXsimRuns = pPStack_18->nXsimRuns + 1;
      }
      clk._0_4_ = 0;
    }
    return (int)clk;
  }
  __assert_fail("RetValue != l_Undef",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                ,0x15c,
                "int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int, int, int)");
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit, int fTryConf, int fUseLit )
{ 
    //int fUseLit = 0;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = Abc_Var2Lit( Pdr_ManFreeVar(p, k), 0 );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, Abc_LitNot(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), fTryConf ? p->pPars->nConfGenLimit : nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
        {
            if ( fTryConf && p->pPars->nConfGenLimit )
                RetValue = l_True;
            else
                return -1;
        }
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
        {
            abctime clk = Abc_Clock();
            if ( p->pPars->fNewXSim )
                *ppPred = Txs3_ManTernarySim( p->pTxs3, k, pCube );
            else
                *ppPred = Pdr_ManTernarySim( p, k, pCube );
            p->tTsim += Abc_Clock() - clk;
            p->nXsimLits += (*ppPred)->nLits;
            p->nXsimRuns++;
        }
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = Abc_LitNot(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}